

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O2

int __thiscall Ym2612_Impl::YM_SET(Ym2612_Impl *this,int Adr,int data)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  channel_t *ch;
  
  iVar6 = 0;
  iVar4 = 0;
  switch(Adr) {
  case 0x22:
    if ((data & 8U) == 0) {
      (this->g).LFOcnt = 0;
      (this->g).LFOinc = 0;
      iVar4 = iVar6;
    }
    else {
      (this->g).LFOinc = (this->g).LFO_INC_TAB[data & 7];
      iVar4 = iVar6;
    }
    break;
  case 0x24:
    iVar4 = ((this->YM2612).TimerA & 3U) + data * 4;
    (this->YM2612).TimerA = iVar4;
    iVar4 = iVar4 * -0x1000 + 0x400000;
    if ((this->YM2612).TimerAL == iVar4) {
      return 0;
    }
    goto LAB_00621d84;
  case 0x25:
    uVar3 = data & 3U | (this->YM2612).TimerA & 0x3fcU;
    (this->YM2612).TimerA = uVar3;
    iVar4 = uVar3 * -0x1000 + 0x400000;
    if ((this->YM2612).TimerAL == iVar4) {
      return 0;
    }
LAB_00621d84:
    (this->YM2612).TimerAL = iVar4;
    (this->YM2612).TimerAcnt = iVar4;
    iVar4 = iVar6;
    break;
  case 0x26:
    (this->YM2612).TimerB = data;
    iVar5 = data * -0x10000 + 0x1000000;
    iVar4 = iVar6;
    if ((this->YM2612).TimerBL != iVar5) {
      (this->YM2612).TimerBL = iVar5;
      (this->YM2612).TimerBcnt = iVar5;
    }
    break;
  case 0x27:
    if ((((this->YM2612).Mode ^ data) & 0x40U) != 0) {
      (this->YM2612).CHANNEL[2].SLOT[0].Finc = -1;
    }
    piVar1 = &(this->YM2612).Status;
    *piVar1 = *piVar1 & data >> 2 & ~(data >> 4);
    (this->YM2612).Mode = data;
    iVar4 = iVar6;
    break;
  case 0x28:
    uVar3 = data & 3;
    if (uVar3 == 3) {
      iVar4 = 1;
    }
    else {
      uVar2 = uVar3 + 3;
      if ((data & 4U) == 0) {
        uVar2 = uVar3;
      }
      ch = (this->YM2612).CHANNEL + uVar2;
      if ((data & 0x10U) == 0) {
        KEY_OFF(this,ch,0);
      }
      else {
        KEY_ON(this,ch,0);
      }
      if ((data & 0x20U) == 0) {
        KEY_OFF(this,ch,2);
      }
      else {
        KEY_ON(this,ch,2);
      }
      if ((data & 0x40U) == 0) {
        KEY_OFF(this,ch,1);
      }
      else {
        KEY_ON(this,ch,1);
      }
      if ((char)data < '\0') {
        KEY_ON(this,ch,3);
        iVar4 = iVar6;
      }
      else {
        KEY_OFF(this,ch,3);
        iVar4 = iVar6;
      }
    }
    break;
  case 0x2b:
    (this->YM2612).DAC = data & 0x80;
    iVar4 = iVar6;
  }
  return iVar4;
}

Assistant:

int Ym2612_Impl::YM_SET(int Adr, int data)
{
	switch ( Adr )
	{
		case 0x22:
			if (data & 8) // LFO enable
			{
				// Cool Spot music 1, LFO modified severals time which
				// distord the sound, have to check that on a real genesis...

				g.LFOinc = g.LFO_INC_TAB [data & 7];
			}
			else
			{
				g.LFOinc = g.LFOcnt = 0;
			}
			break;

		case 0x24:
			YM2612.TimerA = (YM2612.TimerA & 0x003) | (((int) data) << 2);

			if (YM2612.TimerAL != (1024 - YM2612.TimerA) << 12)
			{
				YM2612.TimerAcnt = YM2612.TimerAL = (1024 - YM2612.TimerA) << 12;
			}
			break;

		case 0x25:
			YM2612.TimerA = (YM2612.TimerA & 0x3FC) | (data & 3);

			if (YM2612.TimerAL != (1024 - YM2612.TimerA) << 12)
			{
				YM2612.TimerAcnt = YM2612.TimerAL = (1024 - YM2612.TimerA) << 12;
			}
			break;

		case 0x26:
			YM2612.TimerB = data;

			if (YM2612.TimerBL != (256 - YM2612.TimerB) << (4 + 12))
			{
				YM2612.TimerBcnt = YM2612.TimerBL = (256 - YM2612.TimerB) << (4 + 12);
			}
			break;

		case 0x27:
			// Parametre divers
			// b7 = CSM MODE
			// b6 = 3 slot mode
			// b5 = reset b
			// b4 = reset a
			// b3 = timer enable b
			// b2 = timer enable a
			// b1 = load b
			// b0 = load a

			if ((data ^ YM2612.Mode) & 0x40)
			{
				// We changed the channel 2 mode, so recalculate phase step
				// This fix the punch sound in Street of Rage 2

				YM2612_Special_Update();

				YM2612.CHANNEL [2].SLOT [0].Finc = -1;      // recalculate phase step
			}

//          if ((data & 2) && (YM2612.Status & 2)) YM2612.TimerBcnt = YM2612.TimerBL;
//          if ((data & 1) && (YM2612.Status & 1)) YM2612.TimerAcnt = YM2612.TimerAL;

//          YM2612.Status &= (~data >> 4);                  // Reset du Status au cas ou c'est demande
			YM2612.Status &= (~data >> 4) & (data >> 2);    // Reset Status

			YM2612.Mode = data;
			break;

		case 0x28: {
			int nch = data & 3;
			if ( nch == 3 )
				return 1;
			if ( data & 4 )
				nch += 3;
			channel_t& ch = YM2612.CHANNEL [nch];

			YM2612_Special_Update();

			if (data & 0x10) KEY_ON(ch, S0);    // On appuie sur la touche pour le slot 1
			else KEY_OFF(ch, S0);               // On rel'che la touche pour le slot 1
			if (data & 0x20) KEY_ON(ch, S1);    // On appuie sur la touche pour le slot 3
			else KEY_OFF(ch, S1);               // On rel'che la touche pour le slot 3
			if (data & 0x40) KEY_ON(ch, S2);    // On appuie sur la touche pour le slot 2
			else KEY_OFF(ch, S2);               // On rel'che la touche pour le slot 2
			if (data & 0x80) KEY_ON(ch, S3);    // On appuie sur la touche pour le slot 4
			else KEY_OFF(ch, S3);               // On rel'che la touche pour le slot 4
			break;
		}
		
		case 0x2B:
			if (YM2612.DAC ^ (data & 0x80)) YM2612_Special_Update();

			YM2612.DAC = data & 0x80;   // activation/desactivation du DAC
			break;
	}
	
	return 0;
}